

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5.hpp
# Opt level: O1

void __thiscall trng::mrg5::split(mrg5 *this,uint s,uint n)

{
  int iVar1;
  int iVar2;
  uint i_9;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  uint i;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  int32_t a [5];
  int32_t b [25];
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_98,"invalid argument for trng::mrg5::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_98);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_98);
  }
  if (1 < s) {
    uVar21 = (ulong)n + 1;
    if (n < 0xf) {
      iVar2 = (this->S).r[0];
      iVar3 = (this->S).r[1];
      iVar13 = (this->S).r[2];
      iVar16 = (this->S).r[3];
      iVar15 = (this->S).r[4];
      do {
        iVar1 = iVar16;
        iVar16 = iVar13;
        iVar13 = iVar3;
        iVar3 = iVar2;
        uVar14 = (long)iVar1 * (long)(this->P).a[3] + (long)iVar16 * (long)(this->P).a[2] +
                 (long)iVar13 * (long)(this->P).a[1] + (long)iVar3 * (long)(this->P).a[0];
        uVar17 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar17 = uVar14;
        }
        uVar17 = (long)iVar15 * (long)(this->P).a[4] + uVar17;
        uVar14 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar17 = uVar14;
        }
        uVar14 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar14 = uVar17;
        }
        iVar2 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar2 = (int)uVar14;
        }
        uVar18 = (int)uVar21 - 1;
        uVar21 = (ulong)uVar18;
        iVar15 = iVar1;
      } while (uVar18 != 0);
      (this->S).r[0] = iVar2;
      (this->S).r[1] = iVar3;
      (this->S).r[2] = iVar13;
      (this->S).r[3] = iVar16;
      (this->S).r[4] = iVar1;
    }
    else {
      uVar18 = 0;
      do {
        if ((uVar21 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar21;
        uVar21 = uVar21 >> 1;
      } while (bVar22);
    }
    uVar21 = (ulong)s;
    iVar2 = (this->S).r[0];
    if (s < 0x10) {
      iVar5 = s + (s == 0);
      iVar3 = (this->S).r[1];
      iVar13 = (this->S).r[2];
      iVar16 = (this->S).r[3];
      iVar15 = (this->S).r[4];
      iVar1 = iVar2;
      do {
        iVar6 = iVar1;
        iVar7 = iVar16;
        iVar16 = iVar13;
        iVar13 = iVar3;
        uVar14 = (long)iVar7 * (long)(this->P).a[3] + (long)iVar16 * (long)(this->P).a[2] +
                 (long)iVar13 * (long)(this->P).a[1] + (long)iVar6 * (long)(this->P).a[0];
        uVar17 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar17 = uVar14;
        }
        uVar17 = (long)iVar15 * (long)(this->P).a[4] + uVar17;
        uVar14 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar17 = uVar14;
        }
        uVar14 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar14 = uVar17;
        }
        iVar1 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar1 = (int)uVar14;
        }
        iVar5 = iVar5 + -1;
        iVar3 = iVar6;
        iVar15 = iVar7;
      } while (iVar5 != 0);
      (this->S).r[0] = iVar1;
      (this->S).r[1] = iVar6;
      (this->S).r[2] = iVar13;
      (this->S).r[3] = iVar16;
      (this->S).r[4] = iVar7;
    }
    else {
      uVar18 = 0;
      uVar17 = uVar21;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar22);
    }
    iVar3 = (this->S).r[0];
    if (s < 0x10) {
      iVar6 = s + (s == 0);
      iVar13 = (this->S).r[1];
      iVar16 = (this->S).r[2];
      iVar15 = (this->S).r[3];
      iVar1 = (this->S).r[4];
      iVar5 = iVar3;
      do {
        iVar7 = iVar5;
        iVar8 = iVar15;
        iVar15 = iVar16;
        iVar16 = iVar13;
        uVar14 = (long)iVar8 * (long)(this->P).a[3] + (long)iVar15 * (long)(this->P).a[2] +
                 (long)iVar16 * (long)(this->P).a[1] + (long)iVar7 * (long)(this->P).a[0];
        uVar17 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar17 = uVar14;
        }
        uVar17 = (long)iVar1 * (long)(this->P).a[4] + uVar17;
        uVar14 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar17 = uVar14;
        }
        uVar14 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar14 = uVar17;
        }
        iVar5 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar5 = (int)uVar14;
        }
        iVar6 = iVar6 + -1;
        iVar13 = iVar7;
        iVar1 = iVar8;
      } while (iVar6 != 0);
      (this->S).r[0] = iVar5;
      (this->S).r[1] = iVar7;
      (this->S).r[2] = iVar16;
      (this->S).r[3] = iVar15;
      (this->S).r[4] = iVar8;
    }
    else {
      uVar18 = 0;
      uVar17 = uVar21;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar22);
    }
    iVar13 = (this->S).r[0];
    if (s < 0x10) {
      iVar7 = s + (s == 0);
      iVar16 = (this->S).r[1];
      iVar15 = (this->S).r[2];
      iVar1 = (this->S).r[3];
      iVar5 = (this->S).r[4];
      iVar6 = iVar13;
      do {
        iVar8 = iVar6;
        iVar9 = iVar1;
        iVar1 = iVar15;
        iVar15 = iVar16;
        uVar14 = (long)iVar9 * (long)(this->P).a[3] + (long)iVar1 * (long)(this->P).a[2] +
                 (long)iVar15 * (long)(this->P).a[1] + (long)iVar8 * (long)(this->P).a[0];
        uVar17 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar17 = uVar14;
        }
        uVar17 = (long)iVar5 * (long)(this->P).a[4] + uVar17;
        uVar14 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar17 = uVar14;
        }
        uVar14 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar14 = uVar17;
        }
        iVar6 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar6 = (int)uVar14;
        }
        iVar7 = iVar7 + -1;
        iVar16 = iVar8;
        iVar5 = iVar9;
      } while (iVar7 != 0);
      (this->S).r[0] = iVar6;
      (this->S).r[1] = iVar8;
      (this->S).r[2] = iVar15;
      (this->S).r[3] = iVar1;
      (this->S).r[4] = iVar9;
    }
    else {
      uVar18 = 0;
      uVar17 = uVar21;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar22);
    }
    iVar16 = (this->S).r[0];
    if (s < 0x10) {
      iVar8 = s + (s == 0);
      iVar15 = (this->S).r[1];
      iVar1 = (this->S).r[2];
      iVar5 = (this->S).r[3];
      iVar6 = (this->S).r[4];
      iVar7 = iVar16;
      do {
        iVar9 = iVar7;
        iVar10 = iVar5;
        iVar5 = iVar1;
        iVar1 = iVar15;
        uVar14 = (long)iVar10 * (long)(this->P).a[3] + (long)iVar5 * (long)(this->P).a[2] +
                 (long)iVar1 * (long)(this->P).a[1] + (long)iVar9 * (long)(this->P).a[0];
        uVar17 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar17 = uVar14;
        }
        uVar17 = (long)iVar6 * (long)(this->P).a[4] + uVar17;
        uVar14 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar17 = uVar14;
        }
        uVar14 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar14 = uVar17;
        }
        iVar7 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar7 = (int)uVar14;
        }
        iVar8 = iVar8 + -1;
        iVar15 = iVar9;
        iVar6 = iVar10;
      } while (iVar8 != 0);
      (this->S).r[0] = iVar7;
      (this->S).r[1] = iVar9;
      (this->S).r[2] = iVar1;
      (this->S).r[3] = iVar5;
      (this->S).r[4] = iVar10;
    }
    else {
      uVar18 = 0;
      uVar17 = uVar21;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar22);
    }
    iVar15 = (this->S).r[0];
    if (s < 0x10) {
      iVar9 = s + (s == 0);
      iVar1 = (this->S).r[1];
      iVar5 = (this->S).r[2];
      iVar6 = (this->S).r[3];
      iVar7 = (this->S).r[4];
      iVar8 = iVar15;
      do {
        iVar10 = iVar8;
        iVar11 = iVar6;
        iVar6 = iVar5;
        iVar5 = iVar1;
        uVar14 = (long)iVar11 * (long)(this->P).a[3] + (long)iVar6 * (long)(this->P).a[2] +
                 (long)iVar5 * (long)(this->P).a[1] + (long)iVar10 * (long)(this->P).a[0];
        uVar17 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar17 = uVar14;
        }
        uVar17 = (long)iVar7 * (long)(this->P).a[4] + uVar17;
        uVar14 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar17 = uVar14;
        }
        uVar14 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar14 = uVar17;
        }
        iVar8 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar8 = (int)uVar14;
        }
        iVar9 = iVar9 + -1;
        iVar1 = iVar10;
        iVar7 = iVar11;
      } while (iVar9 != 0);
      (this->S).r[0] = iVar8;
      (this->S).r[1] = iVar10;
      (this->S).r[2] = iVar5;
      (this->S).r[3] = iVar6;
      (this->S).r[4] = iVar11;
    }
    else {
      uVar18 = 0;
      uVar17 = uVar21;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar22);
    }
    iVar1 = (this->S).r[0];
    if (s < 0x10) {
      iVar10 = s + (s == 0);
      iVar5 = (this->S).r[1];
      iVar6 = (this->S).r[2];
      iVar7 = (this->S).r[3];
      iVar8 = (this->S).r[4];
      iVar9 = iVar1;
      do {
        iVar11 = iVar9;
        iVar12 = iVar7;
        iVar7 = iVar6;
        iVar6 = iVar5;
        uVar14 = (long)iVar12 * (long)(this->P).a[3] + (long)iVar7 * (long)(this->P).a[2] +
                 (long)iVar6 * (long)(this->P).a[1] + (long)iVar11 * (long)(this->P).a[0];
        uVar17 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar17 = uVar14;
        }
        uVar17 = (long)iVar8 * (long)(this->P).a[4] + uVar17;
        uVar14 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar17 = uVar14;
        }
        uVar14 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar14 = uVar17;
        }
        iVar9 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar9 = (int)uVar14;
        }
        iVar10 = iVar10 + -1;
        iVar5 = iVar11;
        iVar8 = iVar12;
      } while (iVar10 != 0);
      (this->S).r[0] = iVar9;
      (this->S).r[1] = iVar11;
      (this->S).r[2] = iVar6;
      (this->S).r[3] = iVar7;
      (this->S).r[4] = iVar12;
    }
    else {
      uVar18 = 0;
      uVar17 = uVar21;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar22);
    }
    iVar5 = (this->S).r[0];
    if (s < 0x10) {
      iVar11 = s + (s == 0);
      iVar6 = (this->S).r[1];
      iVar7 = (this->S).r[2];
      iVar8 = (this->S).r[3];
      iVar9 = (this->S).r[4];
      iVar10 = iVar5;
      do {
        iVar12 = iVar10;
        iVar4 = iVar8;
        iVar8 = iVar7;
        iVar7 = iVar6;
        uVar14 = (long)iVar4 * (long)(this->P).a[3] + (long)iVar8 * (long)(this->P).a[2] +
                 (long)iVar7 * (long)(this->P).a[1] + (long)iVar12 * (long)(this->P).a[0];
        uVar17 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar17 = uVar14;
        }
        uVar17 = (long)iVar9 * (long)(this->P).a[4] + uVar17;
        uVar14 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar17 = uVar14;
        }
        uVar14 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar14 = uVar17;
        }
        iVar10 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar10 = (int)uVar14;
        }
        iVar11 = iVar11 + -1;
        iVar6 = iVar12;
        iVar9 = iVar4;
      } while (iVar11 != 0);
      (this->S).r[0] = iVar10;
      (this->S).r[1] = iVar12;
      (this->S).r[2] = iVar7;
      (this->S).r[3] = iVar8;
      (this->S).r[4] = iVar4;
    }
    else {
      uVar18 = 0;
      uVar17 = uVar21;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar22);
    }
    iVar6 = (this->S).r[0];
    if (s < 0x10) {
      iVar12 = s + (s == 0);
      iVar7 = (this->S).r[1];
      iVar8 = (this->S).r[2];
      iVar9 = (this->S).r[3];
      iVar10 = (this->S).r[4];
      iVar11 = iVar6;
      do {
        iVar4 = iVar11;
        iVar19 = iVar9;
        iVar9 = iVar8;
        iVar8 = iVar7;
        uVar14 = (long)iVar19 * (long)(this->P).a[3] + (long)iVar9 * (long)(this->P).a[2] +
                 (long)iVar8 * (long)(this->P).a[1] + (long)iVar4 * (long)(this->P).a[0];
        uVar17 = uVar14 + 0x80000001fffffffe;
        if (uVar14 < 0x7ffffffe00000002) {
          uVar17 = uVar14;
        }
        uVar17 = (long)iVar10 * (long)(this->P).a[4] + uVar17;
        uVar14 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar14 - 0x1fffffffc;
        if (uVar14 < 0x1fffffffc) {
          uVar17 = uVar14;
        }
        uVar14 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar14 = uVar17;
        }
        iVar11 = (int)uVar14 + -0x7fffffff;
        if (uVar14 < 0x7fffffff) {
          iVar11 = (int)uVar14;
        }
        iVar12 = iVar12 + -1;
        iVar7 = iVar4;
        iVar10 = iVar19;
      } while (iVar12 != 0);
      (this->S).r[0] = iVar11;
      (this->S).r[1] = iVar4;
      (this->S).r[2] = iVar8;
      (this->S).r[3] = iVar9;
      (this->S).r[4] = iVar19;
    }
    else {
      uVar18 = 0;
      uVar17 = uVar21;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar22);
    }
    iVar7 = (this->S).r[0];
    if (s < 0x10) {
      iVar4 = s + (s == 0);
      iVar8 = (this->S).r[1];
      iVar9 = (this->S).r[2];
      iVar10 = (this->S).r[3];
      iVar11 = (this->S).r[4];
      iVar12 = iVar7;
      do {
        iVar20 = iVar12;
        iVar19 = iVar10;
        iVar10 = iVar9;
        iVar9 = iVar8;
        uVar17 = (long)iVar19 * (long)(this->P).a[3] + (long)iVar10 * (long)(this->P).a[2] +
                 (long)iVar9 * (long)(this->P).a[1] + (long)iVar20 * (long)(this->P).a[0];
        uVar21 = uVar17 + 0x80000001fffffffe;
        if (uVar17 < 0x7ffffffe00000002) {
          uVar21 = uVar17;
        }
        uVar21 = (long)iVar11 * (long)(this->P).a[4] + uVar21;
        uVar17 = (uVar21 >> 0x1f) + (uVar21 & 0x7fffffff);
        uVar21 = uVar17 - 0x1fffffffc;
        if (uVar17 < 0x1fffffffc) {
          uVar21 = uVar17;
        }
        uVar17 = uVar21 - 0xfffffffe;
        if (uVar21 < 0xfffffffe) {
          uVar17 = uVar21;
        }
        iVar12 = (int)uVar17 + -0x7fffffff;
        if (uVar17 < 0x7fffffff) {
          iVar12 = (int)uVar17;
        }
        iVar4 = iVar4 + -1;
        iVar8 = iVar20;
        iVar11 = iVar19;
      } while (iVar4 != 0);
      (this->S).r[0] = iVar12;
      (this->S).r[1] = iVar20;
      (this->S).r[2] = iVar9;
      (this->S).r[3] = iVar10;
      (this->S).r[4] = iVar19;
    }
    else {
      uVar18 = 0;
      do {
        if ((uVar21 & 1) != 0) {
          jump2(this,uVar18);
        }
        uVar18 = uVar18 + 1;
        bVar22 = 1 < uVar21;
        uVar21 = uVar21 >> 1;
      } while (bVar22);
    }
    local_a8 = (this->S).r[0];
    local_b8 = iVar1;
    iStack_b4 = iVar5;
    iStack_b0 = iVar6;
    iStack_ac = iVar7;
    local_98 = iVar15;
    local_94 = iVar16;
    local_90 = iVar13;
    local_8c = iVar3;
    local_88 = iVar2;
    local_84 = iVar1;
    local_80 = iVar15;
    local_7c = iVar16;
    local_78 = iVar13;
    local_74 = iVar3;
    local_70 = iVar5;
    local_6c = iVar1;
    local_68 = iVar15;
    local_64 = iVar16;
    local_60 = iVar13;
    local_5c = iVar6;
    local_58 = iVar5;
    local_54 = iVar1;
    local_50 = iVar15;
    local_4c = iVar16;
    local_48 = iVar7;
    local_44 = iVar6;
    local_40 = iVar5;
    local_3c = iVar1;
    local_38 = iVar15;
    int_math::gauss<5>((int32_t (*) [25])&local_98,(int32_t (*) [5])&local_b8,0x7fffffff);
    *(ulong *)(this->P).a = CONCAT44(iStack_b4,local_b8);
    *(ulong *)((this->P).a + 2) = CONCAT44(iStack_ac,iStack_b0);
    (this->P).a[4] = local_a8;
    (this->S).r[0] = iVar15;
    (this->S).r[1] = iVar16;
    (this->S).r[2] = iVar13;
    (this->S).r[3] = iVar3;
    (this->S).r[4] = iVar2;
    iVar2 = 5;
    do {
      backward(this);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::mrg5::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      jump(s);
      const int32_t q8{S.r[0]};
      jump(s);
      const int32_t q9{S.r[0]};
      int32_t a[5], b[25];
      a[0] = q5;
      b[0] = q4;
      b[1] = q3;
      b[2] = q2;
      b[3] = q1;
      b[4] = q0;
      a[1] = q6;
      b[5] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      b[9] = q1;
      a[2] = q7;
      b[10] = q6;
      b[11] = q5;
      b[12] = q4;
      b[13] = q3;
      b[14] = q2;
      a[3] = q8;
      b[15] = q7;
      b[16] = q6;
      b[17] = q5;
      b[18] = q4;
      b[19] = q3;
      a[4] = q9;
      b[20] = q8;
      b[21] = q7;
      b[22] = q6;
      b[23] = q5;
      b[24] = q4;
      int_math::gauss<5>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      P.a[4] = a[4];
      S.r[0] = q4;
      S.r[1] = q3;
      S.r[2] = q2;
      S.r[3] = q1;
      S.r[4] = q0;
      for (int i{0}; i < 5; ++i)
        backward();
    }
  }